

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

int Gia_Iso2ManCheckIsoClassOneSkip
              (Gia_Man_t *p,Vec_Int_t *vClass,Vec_Int_t *vRoots,Vec_Int_t *vVec0,Vec_Int_t *vVec1,
              Vec_Int_t *vMap0,Vec_Int_t *vMap1)

{
  int iVar1;
  int i;
  int iPo;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  if (vClass->nSize < 2) {
    __assert_fail("Vec_IntSize(vClass) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso2.c"
                  ,0x22c,
                  "int Gia_Iso2ManCheckIsoClassOneSkip(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iPo = Vec_IntEntry(vClass,0);
  local_48 = vMap0;
  local_40 = vVec0;
  local_38 = vRoots;
  Gia_Iso2ManCollectOrder(p,&iPo,1,vRoots,vVec0,vMap0);
  i = 1;
  while( true ) {
    if (vClass->nSize <= i) {
      return 1;
    }
    iPo = Vec_IntEntry(vClass,i);
    Gia_Iso2ManCollectOrder(p,&iPo,1,local_38,vVec1,vMap1);
    if (local_40->nSize != vVec1->nSize) break;
    iVar1 = Gia_Iso2ManCheckIsoPair(p,local_40,vVec1,local_48,vMap1);
    i = i + 1;
    if (iVar1 == 0) {
      return 0;
    }
  }
  return 0;
}

Assistant:

int Gia_Iso2ManCheckIsoClassOneSkip( Gia_Man_t * p, Vec_Int_t * vClass, Vec_Int_t * vRoots, Vec_Int_t * vVec0, Vec_Int_t * vVec1, Vec_Int_t * vMap0, Vec_Int_t * vMap1 )
{
    int i, iPo;
    assert( Vec_IntSize(vClass) > 1 );
    iPo = Vec_IntEntry( vClass, 0 );
    Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec0, vMap0 );
    Vec_IntForEachEntryStart( vClass, iPo, i, 1 )
    {
        Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec1, vMap1 );
        if ( Vec_IntSize(vVec0) != Vec_IntSize(vVec1) )
            return 0;
        if ( !Gia_Iso2ManCheckIsoPair( p, vVec0, vVec1, vMap0, vMap1 ) )
            return 0;
    }
    return 1;
}